

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

int parsedate(char *date,time_t *output)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  int *piVar11;
  char **ppcVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  char *date_00;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  bool bVar22;
  int local_80;
  int local_7c;
  int local_70;
  char *p;
  int local_5c;
  int local_58;
  int local_54;
  ulong local_50;
  long *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 0;
  local_80 = -1;
  uVar18 = 0xffffffff;
  uVar14 = 0xffffffff;
  uVar15 = 0;
  lVar21 = 0xffffffff;
  local_7c = local_80;
  local_70 = local_80;
  local_5c = local_80;
  local_58 = local_80;
  local_54 = local_80;
  local_48 = output;
  local_40 = date;
  do {
    iVar17 = (int)uVar18;
    iVar8 = (int)uVar14;
    if ((*date == '\0') || (5 < uVar15)) {
      if (local_70 == -1) {
        local_5c = 0;
        local_58 = 0;
        local_70 = 0;
      }
      if ((((iVar8 != -1) && (local_7c != -1)) && (0x62e < iVar17)) &&
         (((iVar8 < 0x20 && (local_7c < 0xc)) &&
          ((local_5c < 0x18 && ((local_58 < 0x3c && (local_70 < 0x3d)))))))) {
        uVar15 = iVar17 - (uint)(local_7c < 2);
        local_54 = 0;
        if (local_80 == -1) {
          local_80 = 0;
        }
        *local_48 = ((long)local_58 +
                    ((long)local_5c +
                    ((long)iVar8 + (long)(iVar17 + -0x7b2) * 0x16d +
                     (long)*(int *)(time2epoch_month_days_cumulative + (long)local_7c * 4) +
                    (long)(int)(uVar15 / 400 + ((uVar15 >> 2) - uVar15 / 100) + -0x1dd)) * 0x18) *
                    0x3c) * 0x3c + (long)local_80 + (long)local_70 + -0x15180;
      }
      return local_54;
    }
    date_00 = date + -1;
    do {
      pcVar16 = date_00;
      bVar4 = pcVar16[1];
      date_00 = pcVar16 + 1;
      date = date + 1;
      if ((0xe5 < (byte)((bVar4 & 0xdf) + 0xa5)) || (bVar4 == 0)) break;
    } while ((byte)(bVar4 - 0x3a) < 0xf6);
    pcVar20 = date_00;
    iVar7 = local_70;
    if ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a) {
      for (uVar19 = 0;
          (((byte)(bVar4 + 0x9f) < 0x1a || (('@' < (char)bVar4 && (bVar4 < 0x5b)))) &&
          (uVar19 < 0xc)); uVar19 = uVar19 + 1) {
        bVar4 = pcVar20[1];
        pcVar20 = pcVar20 + 1;
      }
      if (uVar19 == 0xc) {
        return local_54;
      }
      if ((int)lVar21 == -1) {
        ppcVar12 = weekday;
        if (uVar19 < 4) {
          ppcVar12 = Curl_wkday;
          lVar21 = 0xffffffff;
          if (uVar19 != 3) goto LAB_00144c62;
        }
        for (lVar21 = 0; (int)lVar21 != 7; lVar21 = lVar21 + 1) {
          pcVar16 = ppcVar12[lVar21];
          sVar10 = strlen(pcVar16);
          if ((sVar10 == uVar19) &&
             (iVar8 = curl_strnequal(date_00,pcVar16,uVar19), iVar5 = local_5c, iVar6 = local_58,
             iVar8 != 0)) goto LAB_00144ee9;
        }
        lVar21 = 0xffffffff;
      }
LAB_00144c62:
      if ((local_7c == -1) && (local_7c = -1, uVar19 == 3)) {
        ppcVar12 = Curl_month;
        for (local_7c = 0; local_7c != 0xc; local_7c = local_7c + 1) {
          iVar8 = curl_strnequal(date_00,*ppcVar12,3);
          iVar5 = local_5c;
          iVar6 = local_58;
          if (iVar8 != 0) goto LAB_00144ee9;
          ppcVar12 = ppcVar12 + 1;
        }
        local_7c = -1;
      }
      if (local_80 != -1) {
        return local_54;
      }
      if (4 < uVar19) {
        return local_54;
      }
      lVar13 = 0;
      while( true ) {
        if ((int)lVar13 == 0x33c) {
          return local_54;
        }
        sVar10 = strlen(tz[0].name + lVar13);
        if ((sVar10 == uVar19) &&
           (iVar8 = curl_strnequal(date_00,tz[0].name + lVar13,uVar19), iVar8 != 0)) break;
        lVar13 = lVar13 + 0xc;
      }
      local_80 = *(int *)(tz[0].name + lVar13 + 8) * 0x3c;
      iVar5 = local_5c;
      iVar6 = local_58;
    }
    else {
      iVar5 = local_5c;
      iVar6 = local_58;
      if (((byte)(bVar4 - 0x30) < 10) &&
         (((((local_70 != -1 || (iVar5 = oneortwodigit(date_00,&p), 0x17 < iVar5)) || (*p != ':'))
           || ((9 < (byte)(p[1] - 0x30U) || (iVar6 = oneortwodigit(p + 1,&p), 0x3b < iVar6)))) ||
          ((pcVar20 = p, iVar7 = 0, *p == ':' &&
           (((byte)(p[1] - 0x30U) < 10 &&
            (iVar7 = oneortwodigit(p + 1,&p), pcVar20 = p, 0x3c < iVar7)))))))) {
        piVar11 = __errno_location();
        iVar7 = *piVar11;
        *piVar11 = 0;
        lVar13 = strtol(date_00,&local_38,10);
        iVar5 = *piVar11;
        if (iVar5 != iVar7) {
          *piVar11 = iVar7;
        }
        if (iVar5 != 0) {
          return local_54;
        }
        if (lVar13 - 0x80000000U < 0xffffffff00000000) {
          return local_54;
        }
        uVar9 = curlx_sltosi(lVar13);
        pcVar20 = local_38 + (1 - (long)date);
        if (local_80 == -1) {
          bVar2 = false;
          if ((local_40 < date_00) && (local_38 + -3 == date)) {
            local_80 = -1;
            if ((int)uVar9 < 0x579) {
              cVar1 = *pcVar16;
              if ((cVar1 != '-') && (cVar1 != '+')) {
                pcVar20 = (char *)0x4;
                goto LAB_00144e13;
              }
              iVar7 = ((int)uVar9 / 100) * 0x3c + (int)uVar9 % 100;
              local_80 = iVar7 * -0x3c;
              if (cVar1 != '+') {
                local_80 = iVar7 * 0x3c;
              }
              bVar2 = true;
              pcVar20 = (char *)0x4;
            }
          }
          else {
LAB_00144e13:
            bVar2 = false;
            local_80 = -1;
          }
        }
        else {
          bVar2 = false;
        }
        if ((((pcVar20 == (char *)0x8) && (iVar17 == -1)) && (local_7c == -1)) && (iVar8 == -1)) {
          uVar18 = (long)(int)uVar9 / 10000 & 0xffffffff;
          local_7c = (int)(short)((short)((long)(int)uVar9 % 10000) / 100 + -1);
          uVar14 = (long)(int)uVar9 % 100 & 0xffffffff;
          bVar2 = true;
        }
        bVar3 = (bool)((int)uVar14 == -1 & (int)local_50 == 0 & ~bVar2);
        bVar22 = uVar9 - 1 < 0x1f;
        uVar19 = 0xffffffff;
        if (bVar22) {
          uVar19 = (ulong)uVar9;
        }
        if (bVar3) {
          local_50 = 1;
        }
        if (!bVar3) {
          uVar19 = uVar14;
        }
        bVar22 = (bool)(bVar22 & bVar3);
        uVar14 = uVar19;
        pcVar20 = local_38;
        iVar5 = local_5c;
        iVar6 = local_58;
        if (((bVar22 || bVar2) || ((int)local_50 != 1)) || ((int)uVar18 != -1)) {
          iVar7 = local_70;
          local_50 = local_50 & 0xffffffff;
          if (!bVar22 && !bVar2) {
            return local_54;
          }
        }
        else {
          if ((int)uVar9 < 100) {
            if ((int)uVar9 < 0x47) {
              uVar9 = uVar9 + 2000;
            }
            else {
              uVar9 = uVar9 + 0x76c;
            }
          }
          uVar18 = (ulong)uVar9;
          iVar7 = local_70;
          local_50 = (ulong)((int)uVar19 != -1);
        }
      }
    }
LAB_00144ee9:
    local_58 = iVar6;
    local_5c = iVar5;
    local_70 = iVar7;
    uVar15 = uVar15 + 1;
    date = pcVar20;
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      size_t len = 0;
      const char *p = date;
      while(ISALPHA(*p) && (len < NAME_LEN)) {
        p++;
        len++;
      }

      if(len != NAME_LEN) {
        if(wdaynum == -1) {
          wdaynum = checkday(date, len);
          if(wdaynum != -1)
            found = TRUE;
        }
        if(!found && (monnum == -1)) {
          monnum = checkmonth(date, len);
          if(monnum != -1)
            found = TRUE;
        }

        if(!found && (tzoff == -1)) {
          /* this just must be a time zone string */
          tzoff = checktz(date, len);
          if(tzoff != -1)
            found = TRUE;
        }
      }
      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      if((secnum == -1) &&
         match_time(date, &hournum, &minnum, &secnum, &end)) {
        /* time stamp */
        date = end;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate < date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication. 1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+' ? -tzoff : tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val < 32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32-bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32-bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  /* time2epoch() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature a 64 bits 'long' but ultimately time_t is the
     correct data type to use.
  */
  t = time2epoch(secnum, minnum, hournum, mdaynum, monnum, yearnum);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}